

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O2

int remap(KEYMAP *curmap,int c,PF funct,KEYMAP *pref_map)

{
  short sVar1;
  short sVar2;
  short sVar3;
  KCHAR KVar4;
  PF *pp_Var5;
  keymap_s *pkVar6;
  PF p_Var7;
  ulong uVar8;
  long lVar9;
  map_element *pmVar10;
  map_element *pmVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  bool bVar16;
  
  pmVar11 = ele;
  sVar1 = curmap->map_num;
  pmVar10 = curmap->map_element + sVar1;
  sVar3 = (short)c;
  if ((ele < pmVar10) && (iVar13 = c - ele->k_base, ele->k_base <= c)) {
    pp_Var5 = ele->k_funcp;
    lVar9 = (long)iVar13;
    if (pp_Var5[lVar9] == funct) {
      if (pref_map == (KEYMAP *)0x0 || funct != (PF)0x0) {
        return 1;
      }
      pkVar6 = ele->k_prefmap;
      if (pkVar6 == pref_map) {
        return 1;
      }
LAB_0010e283:
      if (pkVar6 != (keymap_s *)0x0) {
        uVar14 = 1;
        for (lVar12 = 0; (uVar14 != 0 && (lVar12 < lVar9)); lVar12 = lVar12 + 1) {
          uVar14 = (uint)(pp_Var5[lVar12] != (PF)0x0);
        }
        if ((curmap->map_max <= sVar1) && (curmap = reallocmap(curmap), curmap == (KEYMAP *)0x0)) {
          return 0;
        }
        pmVar11 = ele;
        bVar16 = uVar14 == 0;
        pp_Var5 = (PF *)calloc((long)(int)(((uint)bVar16 - c) + (int)ele->k_num),8);
        if (pp_Var5 == (PF *)0x0) {
LAB_0010e34b:
          iVar13 = dobeep_msg("Out of memory");
          return iVar13;
        }
        pmVar11->k_funcp[lVar9] = (PF)0x0;
        sVar1 = ele->k_num;
        sVar2 = ele->k_base;
        iVar15 = 0;
        for (lVar9 = (long)(int)(iVar13 + uVar14); lVar9 <= (long)sVar1 - (long)sVar2;
            lVar9 = lVar9 + 1) {
          pp_Var5[iVar15] = ele->k_funcp[lVar9];
          iVar15 = iVar15 + 1;
        }
        sVar1 = curmap->map_num;
        for (pmVar11 = curmap->map_element + sVar1; ele < pmVar11; pmVar11 = pmVar11 + -1) {
          KVar4 = pmVar11[-1].k_num;
          pmVar11->k_base = pmVar11[-1].k_base;
          pmVar11->k_num = KVar4;
          pkVar6 = pmVar11[-1].k_prefmap;
          pmVar11->k_funcp = pmVar11[-1].k_funcp;
          pmVar11->k_prefmap = pkVar6;
        }
        ele->k_num = sVar3 - (ushort)bVar16;
        ele[1].k_base = (short)uVar14 + sVar3;
        ele[1].k_funcp = pp_Var5;
        pmVar11 = ele + bVar16;
        ele = ele + bVar16;
        pmVar11->k_prefmap = (keymap_s *)0x0;
        curmap->map_num = sVar1 + 1;
        if (pref_map != (KEYMAP *)0x0) {
          ele->k_prefmap = pref_map;
          return 1;
        }
        pkVar6 = (keymap_s *)malloc(0x70);
        if (pkVar6 != (keymap_s *)0x0) {
          pkVar6->map_num = 0;
          pkVar6->map_max = 4;
          pkVar6->map_default = rescan;
          ele->k_prefmap = pkVar6;
          return 1;
        }
        dobeep_msg("Out of memory");
        p_Var7 = curmap->map_default;
        pp_Var5 = ele->k_funcp;
        sVar1 = ele->k_base;
        goto LAB_0010e44a;
      }
      bVar16 = true;
    }
    else {
      if (funct == (PF)0x0) {
        pkVar6 = ele->k_prefmap;
        goto LAB_0010e283;
      }
      bVar16 = false;
    }
    if (pp_Var5[lVar9] == (PF)0x0) {
      ele->k_prefmap = (keymap_s *)0x0;
    }
    pp_Var5[lVar9] = funct;
    if (!bVar16) {
      return 1;
    }
  }
  else {
    iVar15 = 1000;
    iVar13 = 1000;
    if (curmap->map_element < ele) {
      if ((funct != (PF)0x0) || (ele[-1].k_prefmap == (keymap_s *)0x0)) {
        iVar13 = c - ele[-1].k_num;
        goto LAB_0010e032;
      }
      if (ele < pmVar10) {
LAB_0010e072:
        if (ele->k_prefmap == (keymap_s *)0x0) goto LAB_0010e079;
        goto LAB_0010e080;
      }
LAB_0010e181:
      if ((curmap->map_max <= sVar1) && (curmap = reallocmap(curmap), curmap == (KEYMAP *)0x0)) {
        return 0;
      }
      pp_Var5 = (PF *)malloc(8);
      if (pp_Var5 == (PF *)0x0) goto LAB_0010e34b;
      *pp_Var5 = funct;
      pmVar11 = ele;
      sVar1 = curmap->map_num;
      for (pmVar10 = curmap->map_element + sVar1; pmVar11 < pmVar10; pmVar10 = pmVar10 + -1) {
        KVar4 = pmVar10[-1].k_num;
        pmVar10->k_base = pmVar10[-1].k_base;
        pmVar10->k_num = KVar4;
        pkVar6 = pmVar10[-1].k_prefmap;
        pmVar10->k_funcp = pmVar10[-1].k_funcp;
        pmVar10->k_prefmap = pkVar6;
      }
      pmVar11->k_base = sVar3;
      pmVar11->k_num = sVar3;
      pmVar11->k_funcp = pp_Var5;
      pmVar11->k_prefmap = (keymap_s *)0x0;
      curmap->map_num = sVar1 + 1;
    }
    else {
LAB_0010e032:
      if (ele < pmVar10) {
        if (funct == (PF)0x0) goto LAB_0010e072;
LAB_0010e079:
        iVar15 = ele->k_base - c;
      }
LAB_0010e080:
      if ((iVar13 < 5) && (iVar13 <= iVar15)) {
        sVar1 = ele[-1].k_base;
        ele = ele + -1;
        pp_Var5 = (PF *)calloc((long)((c - sVar1) + 1),8);
        if (pp_Var5 == (PF *)0x0) goto LAB_0010e34b;
        sVar2 = pmVar11[-1].k_num;
        for (uVar8 = 0; (long)uVar8 <= (long)sVar2 - (long)(int)sVar1; uVar8 = uVar8 + 1) {
          pp_Var5[uVar8] = pmVar11[-1].k_funcp[uVar8];
        }
        while (iVar13 = iVar13 + -1, iVar13 != 0) {
          pp_Var5[uVar8] = curmap->map_default;
          uVar8 = uVar8 + 1;
        }
        pp_Var5[uVar8 & 0xffffffff] = funct;
        pmVar11[-1].k_num = sVar3;
        pmVar11[-1].k_funcp = pp_Var5;
      }
      else {
        if (4 < iVar15) goto LAB_0010e181;
        sVar1 = ele->k_num;
        pp_Var5 = (PF *)calloc((long)((sVar1 - c) + 1),8);
        if (pp_Var5 == (PF *)0x0) goto LAB_0010e34b;
        sVar2 = pmVar11->k_base;
        lVar9 = (long)iVar15;
        for (lVar12 = 0; lVar12 <= (long)(int)sVar1 - (long)sVar2; lVar12 = lVar12 + 1) {
          pp_Var5[lVar9 + lVar12] = pmVar11->k_funcp[lVar12];
        }
        while (lVar9 = lVar9 + -1, lVar9 != 0) {
          pp_Var5[lVar9] = curmap->map_default;
        }
        *pp_Var5 = funct;
        pmVar11->k_base = sVar3;
        pmVar11->k_funcp = pp_Var5;
      }
    }
    if (funct != (PF)0x0) {
      return 1;
    }
  }
  if (pref_map != (KEYMAP *)0x0) {
    ele->k_prefmap = pref_map;
    return 1;
  }
  pkVar6 = (keymap_s *)malloc(0x70);
  if (pkVar6 != (keymap_s *)0x0) {
    pkVar6->map_num = 0;
    pkVar6->map_max = 4;
    pkVar6->map_default = rescan;
    ele->k_prefmap = pkVar6;
    return 1;
  }
  dobeep_msg("Out of memory");
  p_Var7 = curmap->map_default;
  pp_Var5 = ele->k_funcp;
  sVar1 = ele->k_base;
LAB_0010e44a:
  pp_Var5[(long)c - (long)sVar1] = p_Var7;
  return 0;
}

Assistant:

static int
remap(KEYMAP *curmap, int c, PF funct, KEYMAP *pref_map)
{
	int		 i, n1, n2, nold;
	KEYMAP		*mp, *newmap;
	PF		*pfp;
	struct map_element	*mep;

	if (ele >= &curmap->map_element[curmap->map_num] || c < ele->k_base) {
		if (ele > &curmap->map_element[0] && (funct != NULL ||
		    (ele - 1)->k_prefmap == NULL))
			n1 = c - (ele - 1)->k_num;
		else
			n1 = HUGE;
		if (ele < &curmap->map_element[curmap->map_num] &&
		    (funct != NULL || ele->k_prefmap == NULL))
			n2 = ele->k_base - c;
		else
			n2 = HUGE;
		if (n1 <= MAPELEDEF && n1 <= n2) {
			ele--;
			if ((pfp = calloc(c - ele->k_base + 1,
			    sizeof(PF))) == NULL)
				return (dobeep_msg("Out of memory"));

			nold = ele->k_num - ele->k_base + 1;
			for (i = 0; i < nold; i++)
				pfp[i] = ele->k_funcp[i];
			while (--n1)
				pfp[i++] = curmap->map_default;
			pfp[i] = funct;
			ele->k_num = c;
			ele->k_funcp = pfp;
		} else if (n2 <= MAPELEDEF) {
			if ((pfp = calloc(ele->k_num - c + 1,
			    sizeof(PF))) == NULL)
				return (dobeep_msg("Out of memory"));

			nold = ele->k_num - ele->k_base + 1;
			for (i = 0; i < nold; i++)
				pfp[i + n2] = ele->k_funcp[i];
			while (--n2)
				pfp[n2] = curmap->map_default;
			pfp[0] = funct;
			ele->k_base = c;
			ele->k_funcp = pfp;
		} else {
			if (curmap->map_num >= curmap->map_max) {
				if ((newmap = reallocmap(curmap)) == NULL)
					return (FALSE);
				curmap = newmap;
			}
			if ((pfp = malloc(sizeof(PF))) == NULL)
				return (dobeep_msg("Out of memory"));

			pfp[0] = funct;
			for (mep = &curmap->map_element[curmap->map_num];
			    mep > ele; mep--) {
				mep->k_base = (mep - 1)->k_base;
				mep->k_num = (mep - 1)->k_num;
				mep->k_funcp = (mep - 1)->k_funcp;
				mep->k_prefmap = (mep - 1)->k_prefmap;
			}
			ele->k_base = c;
			ele->k_num = c;
			ele->k_funcp = pfp;
			ele->k_prefmap = NULL;
			curmap->map_num++;
		}
		if (funct == NULL) {
			if (pref_map != NULL)
				ele->k_prefmap = pref_map;
			else {
				if ((mp = malloc(sizeof(KEYMAP) +
				    (MAPINIT - 1) * sizeof(struct map_element))) == NULL) {
					(void)dobeep_msg("Out of memory");
					ele->k_funcp[c - ele->k_base] =
					    curmap->map_default;
					return (FALSE);
				}
				mp->map_num = 0;
				mp->map_max = MAPINIT;
				mp->map_default = rescan;
				ele->k_prefmap = mp;
			}
		}
	} else {
		n1 = c - ele->k_base;
		if (ele->k_funcp[n1] == funct && (funct != NULL ||
		    pref_map == NULL || pref_map == ele->k_prefmap))
			/* no change */
			return (TRUE);
		if (funct != NULL || ele->k_prefmap == NULL) {
			if (ele->k_funcp[n1] == NULL)
				ele->k_prefmap = NULL;
			/* easy case */
			ele->k_funcp[n1] = funct;
			if (funct == NULL) {
				if (pref_map != NULL)
					ele->k_prefmap = pref_map;
				else {
					if ((mp = malloc(sizeof(KEYMAP) +
					    (MAPINIT - 1) *
					    sizeof(struct map_element))) == NULL) {
						(void)dobeep_msg("Out of memory");
						ele->k_funcp[c - ele->k_base] =
						    curmap->map_default;
						return (FALSE);
					}
					mp->map_num = 0;
					mp->map_max = MAPINIT;
					mp->map_default = rescan;
					ele->k_prefmap = mp;
				}
			}
		} else {
			/*
			 * This case is the splits.
			 * Determine which side of the break c goes on
			 * 0 = after break; 1 = before break
			 */
			n2 = 1;
			for (i = 0; n2 && i < n1; i++)
				n2 &= ele->k_funcp[i] != NULL;
			if (curmap->map_num >= curmap->map_max) {
				if ((newmap = reallocmap(curmap)) == NULL)
					return (FALSE);
				curmap = newmap;
			}
			if ((pfp = calloc(ele->k_num - c + !n2,
			    sizeof(PF))) == NULL)
				return (dobeep_msg("Out of memory"));

			ele->k_funcp[n1] = NULL;
			for (i = n1 + n2; i <= ele->k_num - ele->k_base; i++)
				pfp[i - n1 - n2] = ele->k_funcp[i];
			for (mep = &curmap->map_element[curmap->map_num];
			    mep > ele; mep--) {
				mep->k_base = (mep - 1)->k_base;
				mep->k_num = (mep - 1)->k_num;
				mep->k_funcp = (mep - 1)->k_funcp;
				mep->k_prefmap = (mep - 1)->k_prefmap;
			}
			ele->k_num = c - !n2;
			(ele + 1)->k_base = c + n2;
			(ele + 1)->k_funcp = pfp;
			ele += !n2;
			ele->k_prefmap = NULL;
			curmap->map_num++;
			if (pref_map == NULL) {
				if ((mp = malloc(sizeof(KEYMAP) + (MAPINIT - 1)
				    * sizeof(struct map_element))) == NULL) {
					(void)dobeep_msg("Out of memory");
					ele->k_funcp[c - ele->k_base] =
					    curmap->map_default;
					return (FALSE);
				}
				mp->map_num = 0;
				mp->map_max = MAPINIT;
				mp->map_default = rescan;
				ele->k_prefmap = mp;
			} else
				ele->k_prefmap = pref_map;
		}
	}
	return (TRUE);
}